

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O3

void __thiscall gmath::Camera::getProperties(Camera *this,Properties *prop,int id)

{
  Camera *pCVar1;
  Camera *pCVar2;
  undefined1 local_50 [32];
  
  getCameraKey_abi_cxx11_((string *)local_50,(Camera *)prop,"R",id);
  pCVar2 = (Camera *)local_50._0_8_;
  gutil::Properties::putValue<gmath::SMatrix<double,3,3>>(prop,(char *)local_50._0_8_,&this->R);
  pCVar1 = (Camera *)(local_50 + 0x10);
  if ((Camera *)local_50._0_8_ != pCVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  getCameraKey_abi_cxx11_((string *)local_50,pCVar2,"T",id);
  pCVar2 = (Camera *)local_50._0_8_;
  gutil::Properties::putValue<gmath::SVector<double,3>>(prop,(char *)local_50._0_8_,&this->T);
  if ((Camera *)local_50._0_8_ != pCVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  if (this->width != 0) {
    getCameraKey_abi_cxx11_((string *)local_50,pCVar2,"width",id);
    pCVar2 = (Camera *)local_50._0_8_;
    gutil::Properties::putValue<long>(prop,(char *)local_50._0_8_,&this->width);
    if ((Camera *)local_50._0_8_ != pCVar1) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  if (this->height != 0) {
    getCameraKey_abi_cxx11_((string *)local_50,pCVar2,"height",id);
    pCVar2 = (Camera *)local_50._0_8_;
    gutil::Properties::putValue<long>(prop,(char *)local_50._0_8_,&this->height);
    if ((Camera *)local_50._0_8_ != pCVar1) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  if ((((this->zmin != 0.0) || (NAN(this->zmin))) || (this->zmax != 1.79769313486232e+308)) ||
     (NAN(this->zmax))) {
    getCameraKey_abi_cxx11_((string *)local_50,pCVar2,"zmin",id);
    pCVar2 = (Camera *)local_50._0_8_;
    gutil::Properties::putValue<double>(prop,(char *)local_50._0_8_,&this->zmin);
    if ((Camera *)local_50._0_8_ != pCVar1) {
      operator_delete((void *)local_50._0_8_);
    }
    getCameraKey_abi_cxx11_((string *)local_50,pCVar2,"zmax",id);
    pCVar2 = (Camera *)local_50._0_8_;
    gutil::Properties::putValue<double>(prop,(char *)local_50._0_8_,&this->zmax);
    if ((Camera *)local_50._0_8_ != pCVar1) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  if ((this->match).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->match).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    getCameraKey_abi_cxx11_((string *)local_50,pCVar2,"match",id);
    gutil::Properties::putValueVector<std::__cxx11::string>
              (prop,(char *)local_50._0_8_,&this->match,',');
    if ((Camera *)local_50._0_8_ != pCVar1) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  return;
}

Assistant:

void Camera::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("R", id).c_str(), R);
  prop.putValue(getCameraKey("T", id).c_str(), T);

  if (width != 0)
  {
    prop.putValue(getCameraKey("width", id).c_str(), width);
  }

  if (height != 0)
  {
    prop.putValue(getCameraKey("height", id).c_str(), height);
  }

  if (zmin != 0 || zmax != std::numeric_limits<double>::max())
  {
    prop.putValue(getCameraKey("zmin", id).c_str(), zmin);
    prop.putValue(getCameraKey("zmax", id).c_str(), zmax);
  }

  if (match.size() > 0)
  {
    prop.putStringVector(getCameraKey("match", id).c_str(), match, ',');
  }
}